

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Listen.cpp
# Opt level: O3

int __thiscall RenX_ListenPlugin::think(RenX_ListenPlugin *this)

{
  ushort uVar1;
  long *plVar2;
  Server *pSVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  
  plVar2 = (long *)Jupiter::Socket::accept();
  if (plVar2 != (long *)0x0) {
    Jupiter::Socket::setBlocking(SUB81(plVar2,0));
    pSVar3 = (Server *)operator_new(0x3f8);
    RenX::Server::Server
              (pSVar3,plVar2,(this->serverSection)._M_string_length,
               (this->serverSection)._M_dataplus._M_p);
    puVar4 = (undefined8 *)RenX::Server::getSocketHostname_abi_cxx11_();
    uVar5 = *puVar4;
    uVar1 = RenX::Server::getSocketPort();
    printf("Incoming server connected from %s:%u\r\n",uVar5,(ulong)uVar1);
    puVar4 = (undefined8 *)RenX::Server::getSocketHostname_abi_cxx11_();
    uVar5 = *puVar4;
    uVar1 = RenX::Server::getSocketPort();
    RenX::Server::sendLogChan
              ((char *)pSVar3,"Incoming server connected from \x0312%s:%u",uVar5,(ulong)uVar1);
    uVar5 = RenX::getCore();
    RenX::Core::addServer(uVar5);
    if (pSVar3 != (Server *)0x0) {
      (**(code **)(*(long *)pSVar3 + 0x10))();
    }
    (**(code **)(*plVar2 + 0x70))(plVar2);
  }
  return 0;
}

Assistant:

int RenX_ListenPlugin::think() {
	Jupiter::Socket *sock = socket.accept();
	if (sock != nullptr) {
		sock->setBlocking(false);
		std::unique_ptr<RenX::Server> server = std::make_unique<RenX::Server>(std::move(*sock), RenX_ListenPlugin::serverSection);
		printf("Incoming server connected from %s:%u" ENDL, server->getSocketHostname().c_str(), server->getSocketPort());
		server->sendLogChan("Incoming server connected from " IRCCOLOR "12%s:%u", server->getSocketHostname().c_str(), server->getSocketPort());
		RenX::getCore()->addServer(std::move(server));
		delete sock;
	}
	return 0;
}